

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

void Bac_NtkCollapse_rec(Bac_Ntk_t *pNew,Bac_Ntk_t *p,Vec_Int_t *vSigs)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Bac_Ntk_t *pBVar6;
  int iVar7;
  
  Bac_NtkStartCopies(p);
  iVar1 = vSigs->nSize;
  if (iVar1 != (p->vInputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Bac_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x210,"void Bac_NtkCollapse_rec(Bac_Ntk_t *, Bac_Ntk_t *, Vec_Int_t *)");
  }
  for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(&p->vInputs,iVar7);
    iVar2 = Vec_IntEntry(vSigs,iVar7);
    Bac_ObjSetCopy(p,iVar1,iVar2);
    iVar1 = (p->vInputs).nSize;
  }
  iVar1 = 1;
  for (iVar7 = 0; iVar2 = (p->vType).nSize, iVar7 < iVar2; iVar7 = iVar7 + 1) {
    iVar2 = Bac_ObjIsBox(p,iVar7);
    if (iVar2 != 0) {
      iVar3 = Bac_ObjIsBoxPrim(p,iVar7);
      iVar2 = iVar1;
      if (iVar3 == 0) {
        while ((iVar2 < (p->vType).nSize && (iVar3 = Bac_ObjIsBo(p,iVar2), iVar3 != 0))) {
          Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
          Bac_ObjAlloc(pNew,BAC_BOX_BUF,-1);
          iVar3 = Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
          Bac_ObjSetCopy(p,iVar2,iVar3);
          iVar2 = iVar2 + 1;
        }
      }
      else {
        iVar2 = Bac_BoxBiNum(p,iVar7);
        iVar2 = iVar7 - iVar2;
        while (iVar3 = Bac_ObjIsBi(p,iVar2), iVar3 != 0) {
          Bac_ObjDup(pNew,p,iVar2);
          iVar2 = iVar2 + 1;
        }
        iVar2 = Bac_ObjDup(pNew,p,iVar7);
        if ((((p->vName).pArray != (int *)0x0) && ((pNew->vName).pArray != (int *)0x0)) &&
           (iVar3 = Bac_ObjName(p,iVar7), iVar3 != 0)) {
          iVar3 = Bac_ObjName(p,iVar7);
          Bac_ObjSetName(pNew,iVar2,iVar3);
        }
        pBVar6 = Bac_BoxNtk(p,iVar7);
        iVar3 = iVar1;
        if (pBVar6 != (Bac_Ntk_t *)0x0) {
          pBVar6 = Bac_BoxNtk(p,iVar7);
          iVar5 = pBVar6->iCopy;
          iVar4 = Bac_ObjIsBox(pNew,iVar2);
          if (((iVar5 < 1) || (iVar4 == 0)) || (pNew->pDesign->nNtks < iVar5)) {
            __assert_fail("Bac_ObjIsBox(p, i)&&Bac_ManNtkIsOk(p->pDesign, x)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x13e,"void Bac_BoxSetNtkId(Bac_Ntk_t *, int, int)");
          }
          Vec_IntSetEntry(&pNew->vFanin,iVar2,iVar5);
        }
        while ((iVar3 < (p->vType).nSize && (iVar2 = Bac_ObjIsBo(p,iVar3), iVar2 != 0))) {
          Bac_ObjDup(pNew,p,iVar3);
          iVar3 = iVar3 + 1;
        }
      }
    }
    iVar1 = iVar1 + 1;
  }
  p_00 = &p->vCopy;
  iVar7 = 0;
  iVar1 = 1;
  do {
    if (iVar2 <= iVar7) {
      vSigs->nSize = 0;
      for (iVar1 = 0; iVar1 < (p->vOutputs).nSize; iVar1 = iVar1 + 1) {
        iVar7 = Vec_IntEntry(&p->vOutputs,iVar1);
        iVar7 = Bac_ObjFanin(p,iVar7);
        iVar7 = Vec_IntEntry(p_00,iVar7);
        Vec_IntPush(vSigs,iVar7);
      }
      return;
    }
    iVar2 = Bac_ObjIsBox(p,iVar7);
    if (iVar2 != 0) {
      iVar3 = Bac_ObjIsBoxPrim(p,iVar7);
      iVar2 = iVar7;
      if (iVar3 == 0) {
        vSigs->nSize = 0;
        while (0 < iVar2) {
          iVar2 = iVar2 + -1;
          iVar3 = Bac_ObjIsBi(p,iVar2);
          if (iVar3 == 0) break;
          iVar3 = Bac_ObjFanin(p,iVar2);
          iVar3 = Vec_IntEntry(p_00,iVar3);
          Vec_IntPush(vSigs,iVar3);
        }
        pBVar6 = Bac_BoxNtk(p,iVar7);
        Bac_NtkCollapse_rec(pNew,pBVar6,vSigs);
        iVar2 = vSigs->nSize;
        iVar3 = Bac_BoxBoNum(p,iVar7);
        if (iVar2 != iVar3) {
          __assert_fail("Vec_IntSize(vSigs) == Bac_BoxBoNum(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                        ,0x22e,"void Bac_NtkCollapse_rec(Bac_Ntk_t *, Bac_Ntk_t *, Vec_Int_t *)");
        }
        iVar2 = 0;
        while ((iVar3 = iVar1 + iVar2, iVar3 < (p->vType).nSize &&
               (iVar5 = Bac_ObjIsBo(p,iVar3), iVar5 != 0))) {
          iVar3 = Vec_IntEntry(p_00,iVar3);
          iVar5 = Vec_IntEntry(vSigs,iVar2);
          Bac_ObjSetFanin(pNew,iVar3 + -2,iVar5);
          iVar2 = iVar2 + 1;
        }
      }
      else {
        while (0 < iVar2) {
          iVar2 = iVar2 + -1;
          iVar3 = Bac_ObjIsBi(p,iVar2);
          if (iVar3 == 0) break;
          iVar3 = Vec_IntEntry(p_00,iVar2);
          iVar5 = Bac_ObjFanin(p,iVar2);
          iVar5 = Vec_IntEntry(p_00,iVar5);
          Bac_ObjSetFanin(pNew,iVar3,iVar5);
        }
      }
    }
    iVar7 = iVar7 + 1;
    iVar2 = (p->vType).nSize;
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void Bac_NtkCollapse_rec( Bac_Ntk_t * pNew, Bac_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, iObj, iObjNew, iTerm;
    Bac_NtkStartCopies( p );
    // set PI copies
    assert( Vec_IntSize(vSigs) == Bac_NtkPiNum(p) );
    Bac_NtkForEachPi( p, iObj, i )
        Bac_ObjSetCopy( p, iObj, Vec_IntEntry(vSigs, i) );
    // duplicate internal objects and create buffers for hierarchy instances
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjIsBoxPrim( p, iObj ) )
            Bac_BoxDup( pNew, p, iObj );
        else
        {
            Bac_BoxForEachBo( p, iObj, iTerm, i )
            {
                iObjNew = Bac_ObjAlloc( pNew, BAC_OBJ_BI,  -1 );
                iObjNew = Bac_ObjAlloc( pNew, BAC_BOX_BUF, -1 ); // buffer
                iObjNew = Bac_ObjAlloc( pNew, BAC_OBJ_BO,  -1 );
                Bac_ObjSetCopy( p, iTerm, iObjNew );
            }
        }
    // duplicate user modules and connect objects
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjIsBoxPrim( p, iObj ) )
        {
            Bac_BoxForEachBi( p, iObj, iTerm, i )
                Bac_ObjSetFanin( pNew, Bac_ObjCopy(p, iTerm), Bac_ObjCopy(p, Bac_ObjFanin(p, iTerm)) );
        }
        else
        {
            Vec_IntClear( vSigs );
            Bac_BoxForEachBi( p, iObj, iTerm, i )
                Vec_IntPush( vSigs, Bac_ObjCopy(p, Bac_ObjFanin(p, iTerm)) );
            Bac_NtkCollapse_rec( pNew, Bac_BoxNtk(p, iObj), vSigs );
            assert( Vec_IntSize(vSigs) == Bac_BoxBoNum(p, iObj) );
            Bac_BoxForEachBo( p, iObj, iTerm, i )
                Bac_ObjSetFanin( pNew, Bac_ObjCopy(p, iTerm)-2, Vec_IntEntry(vSigs, i) );
        }
    // collect POs
    Vec_IntClear( vSigs );
    Bac_NtkForEachPo( p, iObj, i )
        Vec_IntPush( vSigs, Bac_ObjCopy(p, Bac_ObjFanin(p, iObj)) );
}